

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_norm_wt_mmie_mean
               (vector_t ***in_mean,vector_t ***wt_mean,vector_t ***wt_num_mean,
               vector_t ***wt_den_mean,vector_t ***in_var,vector_t ***wt_num_var,
               vector_t ***wt_den_var,float32 ***num_dnom,float32 ***den_dnom,uint32 n_mgau,
               uint32 n_feat,uint32 n_density,uint32 *veclen,float32 constE)

{
  float den_dnom_00;
  vector_t pfVar1;
  vector_t pfVar2;
  vector_t **pppfVar3;
  uint uVar4;
  vector_t **pppfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float32 fVar10;
  float fVar11;
  
  if (n_mgau != 0) {
    uVar7 = 0;
    do {
      if (n_feat != 0) {
        uVar9 = 0;
        do {
          if (n_density != 0) {
            uVar8 = 0;
            do {
              fVar11 = (float)num_dnom[uVar7][uVar9][uVar8];
              den_dnom_00 = (float)den_dnom[uVar7][uVar9][uVar8];
              if ((((fVar11 != 0.0) || (NAN(fVar11))) || (den_dnom_00 != 0.0)) || (NAN(den_dnom_00))
                 ) {
                fVar10 = cal_constD(in_mean[uVar7][uVar9][uVar8],wt_num_mean[uVar7][uVar9][uVar8],
                                    wt_den_mean[uVar7][uVar9][uVar8],in_var[uVar7][uVar9][uVar8],
                                    wt_num_var[uVar7][uVar9][uVar8],wt_den_var[uVar7][uVar9][uVar8],
                                    (float32)fVar11,(float32)den_dnom_00,veclen[uVar9],constE);
                if ((uint)ABS((float)fVar10) < 0x7f800000) {
                  uVar4 = veclen[uVar9];
                  if (uVar4 != 0) {
                    pppfVar3 = in_mean[uVar7];
                    pppfVar5 = wt_mean[uVar7];
                    uVar6 = 0;
                    do {
                      fVar11 = (pppfVar3[uVar9][uVar8][uVar6] * (float)fVar10 +
                               (wt_num_mean[uVar7][uVar9][uVar8][uVar6] -
                               wt_den_mean[uVar7][uVar9][uVar8][uVar6])) /
                               (((float)num_dnom[uVar7][uVar9][uVar8] -
                                (float)den_dnom[uVar7][uVar9][uVar8]) + (float)fVar10);
                      pppfVar5[uVar9][uVar8][uVar6] = fVar11;
                      if (0x7f7fffff < (uint)ABS(fVar11)) {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x832,
                                "The new mean:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n"
                                ,SUB84((double)fVar11,0),uVar7 & 0xffffffff,uVar9 & 0xffffffff,
                                (int)uVar8,(int)uVar6);
                        pppfVar3 = in_mean[uVar7];
                        pppfVar5 = wt_mean[uVar7];
                        pppfVar5[uVar9][uVar8][uVar6] = pppfVar3[uVar9][uVar8][uVar6];
                        uVar4 = veclen[uVar9];
                      }
                      uVar6 = uVar6 + 1;
                    } while (uVar6 < uVar4);
                  }
                }
                else {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x827,
                          "Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n"
                          ,SUB84((double)(float)fVar10,0),uVar7,uVar9 & 0xffffffff,(int)uVar8);
                  uVar4 = veclen[uVar9];
                  if ((ulong)uVar4 != 0) {
                    pfVar1 = in_mean[uVar7][uVar9][uVar8];
                    pfVar2 = wt_mean[uVar7][uVar9][uVar8];
                    uVar6 = 0;
                    do {
                      pfVar2[uVar6] = pfVar1[uVar6];
                      uVar6 = uVar6 + 1;
                    } while (uVar4 != uVar6);
                  }
                }
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != n_density);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != n_feat);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_norm_wt_mmie_mean(vector_t ***in_mean,
			 vector_t ***wt_mean,
			 vector_t ***wt_num_mean,
			 vector_t ***wt_den_mean,
			 vector_t ***in_var,
			 vector_t ***wt_num_var,
			 vector_t ***wt_den_var,
			 float32 ***num_dnom,
			 float32 ***den_dnom,
			 uint32 n_mgau,
			 uint32 n_feat,
			 uint32 n_density,
			 const uint32 *veclen,
			 float32 constE)
{
    uint32 i, j, k, l;
    float32 d_mmi  = 0.0;
    
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (num_dnom[i][j][k] != 0 || den_dnom[i][j][k] != 0) {
		        
		    /* compute constant D, which controls the convergence speed and accuracy */
		    d_mmi = cal_constD(in_mean[i][j][k], wt_num_mean[i][j][k], wt_den_mean[i][j][k],
				       in_var[i][j][k], wt_num_var[i][j][k], wt_den_var[i][j][k], num_dnom[i][j][k], den_dnom[i][j][k], veclen[j], constE);
		    if (!finite(d_mmi)) {
			E_ERROR("Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n", d_mmi, i, j, k);
    			for (l = 0; l < veclen[j]; l++) {
			    wt_mean[i][j][k][l] = in_mean[i][j][k][l];
    			}
			continue;
		    }
		        
		    /* update mean parameters */
		    for (l = 0; l < veclen[j]; l++) {
			wt_mean[i][j][k][l] = (wt_num_mean[i][j][k][l] - wt_den_mean[i][j][k][l] + d_mmi * in_mean[i][j][k][l]) / (num_dnom[i][j][k] - den_dnom[i][j][k] + d_mmi);
			if (!finite(wt_mean[i][j][k][l])) {
			    E_ERROR("The new mean:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n", wt_mean[i][j][k][l], i, j, k, l);
			    wt_mean[i][j][k][l] = in_mean[i][j][k][l];
			    continue;
			}
		    }
		}
	    }
	}
    }
}